

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O3

SimpleStringInternalCacheNode * __thiscall
SimpleStringInternalCache::createInternalCacheNodes(SimpleStringInternalCache *this)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleStringInternalCacheNode *pSVar2;
  
  iVar1 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                    (this->allocator_,0x78,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                     ,0x3f);
  pSVar2 = (SimpleStringInternalCacheNode *)CONCAT44(extraout_var,iVar1);
  pSVar2->freeMemoryHead_ = (SimpleStringMemoryBlock *)0x0;
  pSVar2->usedMemoryHead_ = (SimpleStringMemoryBlock *)0x0;
  pSVar2[1].freeMemoryHead_ = (SimpleStringMemoryBlock *)0x0;
  pSVar2[1].usedMemoryHead_ = (SimpleStringMemoryBlock *)0x0;
  pSVar2[2].freeMemoryHead_ = (SimpleStringMemoryBlock *)0x0;
  pSVar2[2].usedMemoryHead_ = (SimpleStringMemoryBlock *)0x0;
  pSVar2[3].freeMemoryHead_ = (SimpleStringMemoryBlock *)0x0;
  pSVar2[3].usedMemoryHead_ = (SimpleStringMemoryBlock *)0x0;
  pSVar2[4].freeMemoryHead_ = (SimpleStringMemoryBlock *)0x0;
  pSVar2[4].usedMemoryHead_ = (SimpleStringMemoryBlock *)0x0;
  pSVar2->size_ = 0x20;
  pSVar2[1].size_ = 0x40;
  pSVar2[2].size_ = 0x60;
  pSVar2[3].size_ = 0x80;
  pSVar2[4].size_ = 0x100;
  return pSVar2;
}

Assistant:

SimpleStringInternalCacheNode* SimpleStringInternalCache::createInternalCacheNodes()
{
    SimpleStringInternalCacheNode* node = (SimpleStringInternalCacheNode*) (void*) allocator_->alloc_memory(sizeof(SimpleStringInternalCacheNode) * amountOfInternalCacheNodes, __FILE__, __LINE__);

    for (int i = 0; i < amountOfInternalCacheNodes; i++) {
        node[i].freeMemoryHead_ = NULLPTR;
        node[i].usedMemoryHead_ = NULLPTR;
    }
    node[0].size_ = 32;
    node[1].size_ = 64;
    node[2].size_ = 96;
    node[3].size_ = 128;
    node[4].size_ = 256;
    return node;
}